

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
* findFiles_abi_cxx11_(void)

{
  bool bVar1;
  pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
  *in_RDI;
  bool local_253;
  bool local_251;
  path local_238;
  byte local_209;
  path local_208;
  path local_1e0;
  path local_1b8;
  byte local_189;
  path local_188;
  byte local_159;
  path local_158;
  path local_130;
  path local_108;
  path *local_e0;
  path *path;
  directory_entry *entry;
  undefined1 local_c0 [8];
  recursive_directory_iterator __end1;
  undefined1 local_a0 [8];
  recursive_directory_iterator __begin1;
  path local_80;
  recursive_directory_iterator local_58;
  recursive_directory_iterator *local_48;
  recursive_directory_iterator *__range1;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  headerPaths;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  sourcePaths;
  
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *)
         &headerPaths.
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *)
         &__range1);
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            (&local_58,&local_80);
  std::filesystem::__cxx11::path::~path(&local_80);
  local_48 = &local_58;
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount,local_48);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_a0,(recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&entry,local_48);
  std::filesystem::__cxx11::end((recursive_directory_iterator *)local_c0);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&entry);
  while (bVar1 = std::filesystem::__cxx11::operator!=
                           ((recursive_directory_iterator *)local_a0,
                            (recursive_directory_iterator *)local_c0), bVar1) {
    path = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                             ((recursive_directory_iterator *)local_a0);
    local_e0 = std::filesystem::__cxx11::directory_entry::path((directory_entry *)path);
    local_159 = 0;
    local_189 = 0;
    std::filesystem::__cxx11::path::extension(&local_108,local_e0);
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (&local_130,(char (*) [5])0x124053,auto_format);
    bVar1 = std::filesystem::__cxx11::operator==(&local_108,&local_130);
    local_251 = true;
    if (!bVar1) {
      std::filesystem::__cxx11::path::extension(&local_158,local_e0);
      local_159 = 1;
      std::filesystem::__cxx11::path::path<char[3],std::filesystem::__cxx11::path>
                (&local_188,(char (*) [3])".c",auto_format);
      local_189 = 1;
      local_251 = std::filesystem::__cxx11::operator==(&local_158,&local_188);
    }
    if ((local_189 & 1) != 0) {
      std::filesystem::__cxx11::path::~path(&local_188);
    }
    if ((local_159 & 1) != 0) {
      std::filesystem::__cxx11::path::~path(&local_158);
    }
    std::filesystem::__cxx11::path::~path(&local_130);
    std::filesystem::__cxx11::path::~path(&local_108);
    if (local_251 == false) {
      local_209 = 0;
      std::filesystem::__cxx11::path::extension(&local_1b8,local_e0);
      std::filesystem::__cxx11::path::path<char[3],std::filesystem::__cxx11::path>
                (&local_1e0,(char (*) [3])".h",auto_format);
      bVar1 = std::filesystem::__cxx11::operator==(&local_1b8,&local_1e0);
      local_253 = true;
      if (!bVar1) {
        std::filesystem::__cxx11::path::extension(&local_208,local_e0);
        local_209 = 1;
        std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                  (&local_238,(char (*) [5])".hpp",auto_format);
        local_253 = std::filesystem::__cxx11::operator==(&local_208,&local_238);
        std::filesystem::__cxx11::path::~path(&local_238);
      }
      if ((local_209 & 1) != 0) {
        std::filesystem::__cxx11::path::~path(&local_208);
      }
      std::filesystem::__cxx11::path::~path(&local_1e0);
      std::filesystem::__cxx11::path::~path(&local_1b8);
      if (local_253 != false) {
        std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
        emplace_back<std::filesystem::__cxx11::path_const&>
                  ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                    *)&__range1,local_e0);
      }
    }
    else {
      std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
      emplace_back<std::filesystem::__cxx11::path_const&>
                ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                  *)&headerPaths.
                     super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,local_e0);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)local_a0);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)local_c0);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)local_a0);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_58);
  std::
  pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
  ::
  pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_&,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_&,_true>
            (in_RDI,(vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                     *)&headerPaths.
                        super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
              *)&__range1);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *
          )&__range1);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *
          )&headerPaths.
            super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return in_RDI;
}

Assistant:

std::pair< std::vector<fs::path>, std::vector<fs::path>> findFiles()
{
    std::vector<fs::path> sourcePaths;
    std::vector<fs::path> headerPaths;
    for (auto& entry : fs::recursive_directory_iterator(fs::current_path())) {
        const auto& path = entry.path();
        if (path.extension() == ".cpp" || path.extension() == ".c") {
            sourcePaths.emplace_back(path);
        }
        else if (path.extension() == ".h" || path.extension() == ".hpp") {
            headerPaths.emplace_back(path);
        }
    }
    return { sourcePaths, headerPaths };
}